

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UdpSocket.cpp
# Opt level: O2

void __thiscall Liby::UdpSocket::destroy(UdpSocket *this)

{
  if (this->destroy_ != false) {
    return;
  }
  this->destroy_ = true;
  std::function<void_(Liby::UdpConnection_&)>::operator=(&this->acceptorCallback_,(nullptr_t)0x0);
  std::function<void_(Liby::UdpConnection_&)>::operator=(&this->readEventCallback_,(nullptr_t)0x0);
  std::function<void_(Liby::UdpSocket_&)>::operator=(&this->erroEventCallback_,(nullptr_t)0x0);
  std::deque<Liby::udp_io_task,_std::allocator<Liby::udp_io_task>_>::clear(&this->writTasks_);
  std::
  _Rb_tree<Liby::Endpoint,_std::pair<const_Liby::Endpoint,_std::shared_ptr<Liby::UdpConnection>_>,_std::_Select1st<std::pair<const_Liby::Endpoint,_std::shared_ptr<Liby::UdpConnection>_>_>,_std::less<Liby::Endpoint>,_std::allocator<std::pair<const_Liby::Endpoint,_std::shared_ptr<Liby::UdpConnection>_>_>_>
  ::clear(&(this->conns_)._M_t);
  std::__shared_ptr<Liby::Socket,_(__gnu_cxx::_Lock_policy)2>::reset
            (&(this->socket_).super___shared_ptr<Liby::Socket,_(__gnu_cxx::_Lock_policy)2>);
  std::__uniq_ptr_impl<Liby::Channel,_std::default_delete<Liby::Channel>_>::reset
            ((__uniq_ptr_impl<Liby::Channel,_std::default_delete<Liby::Channel>_> *)&this->chan_,
             (pointer)0x0);
  std::__shared_ptr<Liby::UdpSocket,_(__gnu_cxx::_Lock_policy)2>::reset
            (&(this->self_).super___shared_ptr<Liby::UdpSocket,_(__gnu_cxx::_Lock_policy)2>);
  return;
}

Assistant:

void UdpSocket::destroy() {
    if (destroy_)
        return;

    destroy_ = true;
    acceptorCallback_ = nullptr;
    readEventCallback_ = nullptr;
    erroEventCallback_ = nullptr;
    writTasks_.clear();
    conns_.clear();
    socket_.reset();
    chan_.reset();
    self_.reset();
}